

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-simple.c
# Opt level: O3

void host_ui_event(HostUI *ui,SDL_Event *event)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar10;
  int ih;
  int iw;
  int local_20;
  int local_1c;
  
  if ((event->type == 0x200) && (((event->display).event | 4) == 5)) {
    SDL_GL_GetDrawableSize(ui->window,&local_1c,&local_20);
    fVar4 = (float)local_1c;
    fVar5 = (float)local_20;
    uVar1 = ui->width;
    uVar2 = ui->height;
    fVar10 = (float)(int)uVar1;
    auVar7._8_4_ = fVar10;
    auVar7._4_4_ = fVar10;
    auVar7._12_4_ = fVar10;
    auVar7._0_4_ = (float)local_1c;
    auVar8._4_4_ = (float)(int)uVar2;
    auVar8._0_4_ = (float)local_20;
    auVar8._8_8_ = 0;
    auVar8 = divps(auVar7,auVar8);
    fVar9 = auVar8._4_4_;
    uVar3 = -(uint)(auVar8._0_4_ < fVar9);
    fVar6 = (float)(~uVar3 & (uint)(fVar9 * fVar5) | uVar3 & (uint)fVar4);
    fVar10 = fVar5;
    if (auVar8._0_4_ < fVar9) {
      fVar10 = fVar4 / fVar9;
    }
    glViewport((int)((fVar4 - fVar6) * 0.5),(int)((fVar5 - fVar10) * 0.5),(int)fVar6,(int)fVar10);
  }
  return;
}

Assistant:

void host_ui_event(struct HostUI* ui, union SDL_Event* event) {
  if (event->type == SDL_WINDOWEVENT &&
      (event->window.event == SDL_WINDOWEVENT_SHOWN ||
       event->window.event == SDL_WINDOWEVENT_RESIZED)) {
    int iw, ih;
    SDL_GL_GetDrawableSize(ui->window, &iw, &ih);
    f32 w = iw, h = ih;
    f32 aspect = w / h;
    f32 want_aspect = (f32)ui->width / ui->height;
    f32 new_w = aspect < want_aspect ? w : h * want_aspect;
    f32 new_h = aspect < want_aspect ? w / want_aspect : h;
    f32 new_left = (w - new_w) * 0.5f;
    f32 new_top = (h - new_h) * 0.5f;
    glViewport(new_left, new_top, new_w, new_h);
  }
}